

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool PartStream_BlockRead
               (TBlockStream *pStream,ULONGLONG StartOffset,ULONGLONG EndOffset,LPBYTE BlockBuffer,
               DWORD BytesNeeded,bool bAvailable)

{
  bool bVar1;
  DWORD dwBytesToRead;
  ulong uVar2;
  uint local_4c;
  DWORD BlockIndex;
  DWORD BytesToRead;
  ULONGLONG ByteOffset;
  PPART_FILE_MAP_ENTRY FileBitmap;
  bool bAvailable_local;
  LPBYTE pBStack_30;
  DWORD BytesNeeded_local;
  LPBYTE BlockBuffer_local;
  ULONGLONG EndOffset_local;
  ULONGLONG StartOffset_local;
  TBlockStream *pStream_local;
  
  FileBitmap._3_1_ = bAvailable;
  FileBitmap._4_4_ = BytesNeeded;
  pBStack_30 = BlockBuffer;
  BlockBuffer_local = (LPBYTE)EndOffset;
  EndOffset_local = StartOffset;
  StartOffset_local = (ULONGLONG)pStream;
  if (pStream->FileBitmap == (void *)0x0) {
    __assert_fail("pStream->FileBitmap != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x644,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if ((StartOffset & pStream->BlockSize - 1) != 0) {
    __assert_fail("(StartOffset & (pStream->BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x645,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if (EndOffset <= StartOffset) {
    __assert_fail("StartOffset < EndOffset",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x646,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if (bAvailable) {
    ByteOffset = (long)pStream->FileBitmap + (StartOffset / pStream->BlockSize & 0xffffffff) * 0x14;
    for (; EndOffset_local < BlockBuffer_local;
        EndOffset_local = *(uint *)(StartOffset_local + 0xec) + EndOffset_local) {
      local_4c = (int)BlockBuffer_local - (int)EndOffset_local;
      if (*(uint *)(StartOffset_local + 0xec) < local_4c) {
        local_4c = *(uint *)(StartOffset_local + 0xec);
      }
      if (FileBitmap._4_4_ < local_4c) {
        local_4c = FileBitmap._4_4_;
      }
      _BlockIndex = *(undefined8 *)(ByteOffset + 4);
      uVar2 = (**(code **)(StartOffset_local + 0x50))
                        (StartOffset_local,&BlockIndex,pBStack_30,local_4c);
      if ((uVar2 & 1) == 0) {
        return false;
      }
      pBStack_30 = pBStack_30 + *(uint *)(StartOffset_local + 0xec);
      FileBitmap._4_4_ = FileBitmap._4_4_ - *(int *)(StartOffset_local + 0xec);
      ByteOffset = ByteOffset + 0x14;
    }
  }
  else {
    if ((pStream->super_TFileStream).pMaster == (TFileStream *)0x0) {
      return false;
    }
    dwBytesToRead = (int)EndOffset - (int)StartOffset;
    bVar1 = FileStream_Read((pStream->super_TFileStream).pMaster,&EndOffset_local,BlockBuffer,
                            dwBytesToRead);
    if (!bVar1) {
      return false;
    }
    uVar2 = (**(code **)(StartOffset_local + 0x68))(StartOffset_local,&BlockIndex);
    if (((uVar2 & 1) != 0) &&
       (uVar2 = (**(code **)(StartOffset_local + 0x58))
                          (StartOffset_local,&BlockIndex,pBStack_30,dwBytesToRead), (uVar2 & 1) != 0
       )) {
      PartStream_UpdateBitmap
                ((TBlockStream *)StartOffset_local,EndOffset_local,(ULONGLONG)BlockBuffer_local,
                 _BlockIndex);
    }
  }
  return true;
}

Assistant:

static bool PartStream_BlockRead(
    TBlockStream * pStream,
    ULONGLONG StartOffset,
    ULONGLONG EndOffset,
    LPBYTE BlockBuffer,
    DWORD BytesNeeded,
    bool bAvailable)
{
    PPART_FILE_MAP_ENTRY FileBitmap;
    ULONGLONG ByteOffset;
    DWORD BytesToRead;
    DWORD BlockIndex = (DWORD)(StartOffset / pStream->BlockSize);

    // The starting offset must be aligned to size of the block
    assert(pStream->FileBitmap != NULL);
    assert((StartOffset & (pStream->BlockSize - 1)) == 0);
    assert(StartOffset < EndOffset);

    // If the blocks are not available, we need to load them from the master
    // and then save to the mirror
    if(bAvailable == false)
    {
        // If we have no master, we cannot satisfy read request
        if(pStream->pMaster == NULL)
            return false;

        // Load the blocks from the master stream
        // Note that we always have to read complete blocks
        // so they get properly stored to the mirror stream
        BytesToRead = (DWORD)(EndOffset - StartOffset);
        if(!FileStream_Read(pStream->pMaster, &StartOffset, BlockBuffer, BytesToRead))
            return false;

        // The loaded blocks are going to be stored to the end of the file
        // Note that this operation is not required to succeed
        if(pStream->BaseGetSize(pStream, &ByteOffset))
        {
            // Store the loaded blocks to the mirror file.
            if(pStream->BaseWrite(pStream, &ByteOffset, BlockBuffer, BytesToRead))
            {
                PartStream_UpdateBitmap(pStream, StartOffset, EndOffset, ByteOffset);
            }
        }
    }
    else
    {
        // Get the file map entry
        FileBitmap = (PPART_FILE_MAP_ENTRY)pStream->FileBitmap + BlockIndex;

        // Read all blocks
        while(StartOffset < EndOffset)
        {
            // Get the number of bytes to be read
            BytesToRead = (DWORD)(EndOffset - StartOffset);
            if(BytesToRead > pStream->BlockSize)
                BytesToRead = pStream->BlockSize;
            if(BytesToRead > BytesNeeded)
                BytesToRead = BytesNeeded;

            // Read the block
            ByteOffset = MAKE_OFFSET64(FileBitmap->BlockOffsHi, FileBitmap->BlockOffsLo);
            if(!pStream->BaseRead(pStream, &ByteOffset, BlockBuffer, BytesToRead))
                return false;

            // Move the pointers
            StartOffset += pStream->BlockSize;
            BlockBuffer += pStream->BlockSize;
            BytesNeeded -= pStream->BlockSize;
            FileBitmap++;
        }
    }

    return true;
}